

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O2

void helics::processOptions
               (value *section,
               function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *optionConversion,
               function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *valueConversion,function<void_(int,_int)> *optionAction)

{
  basic_value<toml::type_config> *this;
  int __args;
  uint __args_1;
  table_type *ptVar1;
  boolean_type *pbVar2;
  uint *puVar3;
  string_type *__args_00;
  __node_base *p_Var4;
  
  ptVar1 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(section);
  p_Var4 = &(ptVar1->_M_h)._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    if (1 < (byte)(*(char *)&p_Var4[5]._M_nxt - 9U)) {
      __args = std::
               function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::operator()(optionConversion,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var4 + 1));
      if (-1 < __args) {
        this = (basic_value<toml::type_config> *)(p_Var4 + 5);
        if (this->type_ == integer) {
          puVar3 = (uint *)toml::basic_value<toml::type_config>::as_integer(this);
          __args_1 = *puVar3;
        }
        else if (this->type_ == boolean) {
          pbVar2 = toml::basic_value<toml::type_config>::as_boolean(this);
          __args_1 = (uint)*pbVar2;
        }
        else {
          __args_00 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
          __args_1 = std::
                     function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::operator()(valueConversion,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__args_00);
        }
        std::function<void_(int,_int)>::operator()(optionAction,__args,__args_1);
      }
    }
  }
  return;
}

Assistant:

void processOptions(const toml::value& section,
                    const std::function<int(const std::string&)>& optionConversion,
                    const std::function<int(const std::string&)>& valueConversion,
                    const std::function<void(int, int)>& optionAction)
{
    const auto& table = section.as_table();
    for (const auto& telement : table) {
        if (telement.second.is_array() || telement.second.is_table()) {
            continue;
        }
        const int32_t index = optionConversion(telement.first);
        if (index >= 0) {
            int32_t val = -1;
            if (telement.second.is_boolean()) {
                val = telement.second.as_boolean() ? 1 : 0;
            } else if (telement.second.is_integer()) {
                val = telement.second.as_integer();
            } else {
                val = valueConversion(telement.second.as_string());
            }
            optionAction(index, val);
        }
    }
}